

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ORForest.cpp
# Opt level: O0

void __thiscall
RandomForest::ORForest<float>::GetRankedGiniImportance
          (ORForest<float> *this,
          shared_ptr<std::vector<int,_std::allocator<int>_>_> *o_featureIndexList,
          shared_ptr<std::vector<double,_std::allocator<double>_>_> *o_giniImportanceList)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  double dVar1;
  double dVar2;
  value_type vVar3;
  value_type vVar4;
  bool bVar5;
  element_type *peVar6;
  element_type *peVar7;
  __shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var8;
  element_type *peVar9;
  size_type sVar10;
  element_type *peVar11;
  ulong uVar12;
  reference pvVar13;
  reference pvVar14;
  pointer this_01;
  int rightIndex;
  int leftIndex;
  double rightValue;
  double leftValue;
  int j_1;
  int i_1;
  undefined1 local_78 [28];
  int j;
  __normal_iterator<RandomForest::ODTree<float>_*,_std::vector<RandomForest::ODTree<float>,_std::allocator<RandomForest::ODTree<float>_>_>_>
  local_58;
  TreeListIterator tree_iter;
  int i;
  undefined1 local_40 [8];
  shared_ptr<std::vector<double,_std::allocator<double>_>_> giniImportanceList;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> featureIndexList;
  shared_ptr<std::vector<double,_std::allocator<double>_>_> *o_giniImportanceList_local;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> *o_featureIndexList_local;
  ORForest<float> *this_local;
  
  this_00 = &giniImportanceList.
             super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount;
  std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::shared_ptr
            ((shared_ptr<std::vector<int,_std::allocator<int>_>_> *)this_00,o_featureIndexList);
  std::shared_ptr<std::vector<double,_std::allocator<double>_>_>::shared_ptr
            ((shared_ptr<std::vector<double,_std::allocator<double>_>_> *)local_40,
             o_giniImportanceList);
  peVar6 = std::
           __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_00);
  peVar7 = std::
           __shared_ptr_access<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->trainData);
  p_Var8 = (__shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>
              ::at(peVar7,0);
  peVar9 = std::
           __shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var8);
  sVar10 = std::vector<float,_std::allocator<float>_>::size(peVar9);
  std::vector<int,_std::allocator<int>_>::resize(peVar6,sVar10 - 1);
  peVar11 = std::
            __shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_40);
  peVar7 = std::
           __shared_ptr_access<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->trainData);
  p_Var8 = (__shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>
              ::at(peVar7,0);
  peVar9 = std::
           __shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var8);
  sVar10 = std::vector<float,_std::allocator<float>_>::size(peVar9);
  std::vector<double,_std::allocator<double>_>::resize(peVar11,sVar10 - 1);
  tree_iter._M_current._0_4_ = 0;
  while( true ) {
    uVar12 = (ulong)(int)tree_iter._M_current;
    peVar6 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&giniImportanceList.
                              super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    sVar10 = std::vector<int,_std::allocator<int>_>::size(peVar6);
    vVar3 = (int)tree_iter._M_current;
    if (sVar10 <= uVar12) break;
    peVar6 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&giniImportanceList.
                              super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    pvVar13 = std::vector<int,_std::allocator<int>_>::at(peVar6,(long)(int)tree_iter._M_current);
    *pvVar13 = vVar3;
    peVar11 = std::
              __shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_40);
    pvVar14 = std::vector<double,_std::allocator<double>_>::at
                        (peVar11,(long)(int)tree_iter._M_current);
    *pvVar14 = 0.0;
    tree_iter._M_current._0_4_ = (int)tree_iter._M_current + 1;
  }
  local_58._M_current =
       (ODTree<float> *)
       std::vector<RandomForest::ODTree<float>,_std::allocator<RandomForest::ODTree<float>_>_>::
       begin(&this->trees);
  while( true ) {
    register0x00000000 =
         std::vector<RandomForest::ODTree<float>,_std::allocator<RandomForest::ODTree<float>_>_>::
         end(&this->trees);
    bVar5 = __gnu_cxx::operator!=
                      (&local_58,
                       (__normal_iterator<RandomForest::ODTree<float>_*,_std::vector<RandomForest::ODTree<float>,_std::allocator<RandomForest::ODTree<float>_>_>_>
                        *)(local_78 + 0x18));
    if (!bVar5) break;
    this_01 = __gnu_cxx::
              __normal_iterator<RandomForest::ODTree<float>_*,_std::vector<RandomForest::ODTree<float>,_std::allocator<RandomForest::ODTree<float>_>_>_>
              ::operator->(&local_58);
    ODTree<float>::UpdateGiniImportance(this_01);
    local_78._20_4_ = 0;
    while( true ) {
      uVar12 = (ulong)(int)local_78._20_4_;
      peVar6 = std::
               __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&giniImportanceList.
                                super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
      sVar10 = std::vector<int,_std::allocator<int>_>::size(peVar6);
      if (sVar10 <= uVar12) break;
      peVar11 = std::
                __shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_40);
      pvVar14 = std::vector<double,_std::allocator<double>_>::at(peVar11,(long)(int)local_78._20_4_)
      ;
      dVar1 = *pvVar14;
      __gnu_cxx::
      __normal_iterator<RandomForest::ODTree<float>_*,_std::vector<RandomForest::ODTree<float>,_std::allocator<RandomForest::ODTree<float>_>_>_>
      ::operator->(&local_58);
      ODTree<float>::GetGiniImportance((ODTree<float> *)local_78);
      peVar11 = std::
                __shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_78);
      pvVar14 = std::vector<double,_std::allocator<double>_>::at(peVar11,(long)(int)local_78._20_4_)
      ;
      dVar2 = *pvVar14;
      peVar11 = std::
                __shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_40);
      pvVar14 = std::vector<double,_std::allocator<double>_>::at(peVar11,(long)(int)local_78._20_4_)
      ;
      *pvVar14 = dVar1 + dVar2;
      std::shared_ptr<std::vector<double,_std::allocator<double>_>_>::~shared_ptr
                ((shared_ptr<std::vector<double,_std::allocator<double>_>_> *)local_78);
      local_78._20_4_ = local_78._20_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<RandomForest::ODTree<float>_*,_std::vector<RandomForest::ODTree<float>,_std::allocator<RandomForest::ODTree<float>_>_>_>
    ::operator++(&local_58,0);
  }
  leftValue._4_4_ = 0;
  while( true ) {
    peVar6 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&giniImportanceList.
                              super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    sVar10 = std::vector<int,_std::allocator<int>_>::size(peVar6);
    leftValue._0_4_ = leftValue._4_4_;
    if (sVar10 - 1 <= (ulong)(long)leftValue._4_4_) break;
    while( true ) {
      leftValue._0_4_ = leftValue._0_4_ + 1;
      peVar6 = std::
               __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&giniImportanceList.
                                super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
      sVar10 = std::vector<int,_std::allocator<int>_>::size(peVar6);
      if (sVar10 <= (ulong)(long)leftValue._0_4_) break;
      peVar11 = std::
                __shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_40);
      pvVar14 = std::vector<double,_std::allocator<double>_>::at(peVar11,(long)leftValue._4_4_);
      dVar1 = *pvVar14;
      peVar11 = std::
                __shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_40);
      pvVar14 = std::vector<double,_std::allocator<double>_>::at(peVar11,(long)leftValue._0_4_);
      dVar2 = *pvVar14;
      if (dVar1 < dVar2) {
        peVar6 = std::
                 __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&giniImportanceList.
                                  super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        pvVar13 = std::vector<int,_std::allocator<int>_>::at(peVar6,(long)leftValue._4_4_);
        vVar3 = *pvVar13;
        peVar6 = std::
                 __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&giniImportanceList.
                                  super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        pvVar13 = std::vector<int,_std::allocator<int>_>::at(peVar6,(long)leftValue._0_4_);
        vVar4 = *pvVar13;
        peVar11 = std::
                  __shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_40);
        pvVar14 = std::vector<double,_std::allocator<double>_>::at(peVar11,(long)leftValue._4_4_);
        *pvVar14 = dVar2;
        peVar11 = std::
                  __shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_40);
        pvVar14 = std::vector<double,_std::allocator<double>_>::at(peVar11,(long)leftValue._0_4_);
        *pvVar14 = dVar1;
        peVar6 = std::
                 __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&giniImportanceList.
                                  super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        pvVar13 = std::vector<int,_std::allocator<int>_>::at(peVar6,(long)leftValue._4_4_);
        *pvVar13 = vVar4;
        peVar6 = std::
                 __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&giniImportanceList.
                                  super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        pvVar13 = std::vector<int,_std::allocator<int>_>::at(peVar6,(long)leftValue._0_4_);
        *pvVar13 = vVar3;
      }
    }
    leftValue._4_4_ = leftValue._4_4_ + 1;
  }
  std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::operator=
            (o_featureIndexList,
             (shared_ptr<std::vector<int,_std::allocator<int>_>_> *)
             &giniImportanceList.
              super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::shared_ptr<std::vector<double,_std::allocator<double>_>_>::operator=
            (o_giniImportanceList,
             (shared_ptr<std::vector<double,_std::allocator<double>_>_> *)local_40);
  std::shared_ptr<std::vector<double,_std::allocator<double>_>_>::~shared_ptr
            ((shared_ptr<std::vector<double,_std::allocator<double>_>_> *)local_40);
  std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr
            ((shared_ptr<std::vector<int,_std::allocator<int>_>_> *)
             &giniImportanceList.
              super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void RandomForest::ORForest<T>::GetRankedGiniImportance( std::shared_ptr<std::vector<int> > * o_featureIndexList,  std::shared_ptr<std::vector<double> > * o_giniImportanceList)
{
    std::shared_ptr<std::vector<int> > featureIndexList=* o_featureIndexList;
    std::shared_ptr<std::vector<double> > giniImportanceList=* o_giniImportanceList;
    featureIndexList->resize(trainData->at(0)->size()-1);
    giniImportanceList->resize(trainData->at(0)->size()-1);
    for(int i=0;i<featureIndexList->size();i++)
    {
        featureIndexList->at(i)=i;
        giniImportanceList->at(i)=0.0;
    }
    for (TreeListIterator tree_iter = trees.begin(); tree_iter != trees.end(); tree_iter++)
    {
        tree_iter->UpdateGiniImportance();
        for(int j=0;j<featureIndexList->size();j++)
        {
            giniImportanceList->at(j) = giniImportanceList->at(j) + tree_iter->GetGiniImportance()->at(j);
        }
    }
    
    // sorting
    for(int i=0;i<featureIndexList->size()-1;i++)
    {
        for(int j=i+1;j<featureIndexList->size();j++)
        {
            double leftValue=giniImportanceList->at(i);
            double rightValue=giniImportanceList->at(j);
            if(leftValue<rightValue)
            {
                int leftIndex=featureIndexList->at(i);
                int rightIndex=featureIndexList->at(j);
                giniImportanceList->at(i)=rightValue;
                giniImportanceList->at(j)=leftValue;
                featureIndexList->at(i)=rightIndex;
                featureIndexList->at(j)=leftIndex;
            }
        }
    }
    
    *o_featureIndexList=featureIndexList;
    *o_giniImportanceList=giniImportanceList;
}